

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptStructDeclarationList
          (HlslGrammar *this,TTypeList **typeList,TIntermNode **nodeList,
          TVector<glslang::TFunctionDeclarator> *declarators)

{
  HlslToken *loc;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_00;
  iterator __position;
  vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
  *pvVar1;
  TTypeList **ppTVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  TPoolAllocator *pTVar7;
  TTypeList *pTVar8;
  TType *this_01;
  undefined4 extraout_var;
  char *pcVar9;
  TIntermNode **ppTVar10;
  HlslParseContext *pHVar11;
  _func_int **pp_Var12;
  _List_node_header *p_Var13;
  TArraySizes *arraySizes;
  TIntermTyped *expressionNode;
  TTypeLoc member;
  TAttributes attributes;
  HlslToken idToken;
  TType memberType;
  TArraySizes *local_160;
  vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
  *local_158;
  TIntermNode **local_150;
  TTypeList **local_148;
  TIntermTyped *local_140;
  TTypeLoc local_138;
  TAttributes local_118;
  HlslToken local_f8;
  TType local_c8;
  
  pTVar7 = GetThreadPoolAllocator();
  pTVar8 = (TTypeList *)TPoolAllocator::allocate(pTVar7,0x20);
  (pTVar8->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
  super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (pTVar8->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar8->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar8->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar7 = GetThreadPoolAllocator();
  (pTVar8->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
  super__Tp_alloc_type.allocator = pTVar7;
  (pTVar8->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar8->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar8->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *typeList = pTVar8;
  local_f8.field_2.string = (TString *)0x0;
  local_f8.loc.name = (TString *)0x0;
  local_f8.loc.string = 0;
  local_f8.loc.line = 0;
  local_f8.loc.column = 0;
  bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
  if (!bVar3) {
    loc = &(this->super_HlslTokenStream).token;
    local_158 = &declarators->
                 super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
    ;
    local_150 = nodeList;
    local_148 = typeList;
    do {
      ppTVar10 = local_150;
      p_Var13 = &local_118.
                 super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                 .
                 super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                 ._M_impl._M_node;
      local_118.
      super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
      super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
      _M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
      local_118.
      super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
      super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
      _M_impl._M_node._M_size = 0;
      local_118.
      super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
      super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
      _M_impl._M_node.super__List_node_base._M_next = &p_Var13->super__List_node_base;
      local_118.
      super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
      super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>.
      _M_impl._M_node.super__List_node_base._M_prev = &p_Var13->super__List_node_base;
      acceptAttributes(this,&local_118);
      TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      bVar4 = acceptFullySpecifiedType(this,&local_c8,ppTVar10,&local_118,false);
      if (!bVar4) {
        pHVar11 = this->parseContext;
        pp_Var12 = (pHVar11->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar9 = "member type";
LAB_003a75a2:
        (*pp_Var12[0x2d])(pHVar11,loc,"Expected",pcVar9,"");
        return bVar3;
      }
      bVar4 = false;
      HlslParseContext::transferTypeAttributes
                (this->parseContext,&loc->loc,&local_118,&local_c8,false);
      ppTVar2 = local_148;
      while( true ) {
        bVar5 = acceptIdentifier(this,&local_f8);
        if (!bVar5) {
          pHVar11 = this->parseContext;
          pp_Var12 = (pHVar11->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar9 = "member name";
          goto LAB_003a75a2;
        }
        bVar5 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
        pvVar1 = local_158;
        if (bVar5) {
          if (!bVar4) {
            ppTVar10 = (TIntermNode **)
                       (((long)(local_158->
                               super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_158->
                               super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x71c71c71c71c71c7 + 1);
            std::
            vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
            ::resize(local_158,(size_type)ppTVar10);
            bVar4 = acceptMemberFunctionDefinition
                              (this,ppTVar10,&local_c8,local_f8.field_2.string,
                               (pvVar1->
                               super__Vector_base<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                               )._M_impl.super__Vector_impl_data._M_finish + -1);
            if (bVar4) goto LAB_003a74d6;
          }
          pHVar11 = this->parseContext;
          pp_Var12 = (pHVar11->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar9 = "member-function definition";
          goto LAB_003a75a2;
        }
        pTVar7 = GetThreadPoolAllocator();
        this_01 = (TType *)TPoolAllocator::allocate(pTVar7,0x98);
        TType::TType(this_01,EbtVoid,EvqTemporary,1,0,0,false);
        local_138.loc.column = (this->super_HlslTokenStream).token.loc.column;
        local_138.loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
        local_138.loc.name = (loc->loc).name;
        local_138.loc.string = (this->super_HlslTokenStream).token.loc.string;
        local_138.loc.line = (this->super_HlslTokenStream).token.loc.line;
        local_138.type = this_01;
        TType::shallowCopy(this_01,&local_c8);
        (*(local_138.type)->_vptr_TType[4])(local_138.type,local_f8.field_2.string);
        this_00 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)*ppTVar2;
        __position._M_current = *(TTypeLoc **)(this_00 + 0x10);
        if (__position._M_current == *(TTypeLoc **)(this_00 + 0x18)) {
          std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
          _M_realloc_insert<glslang::TTypeLoc_const&>(this_00,__position,&local_138);
        }
        else {
          ((__position._M_current)->loc).string = local_138.loc.string;
          ((__position._M_current)->loc).line = local_138.loc.line;
          ((__position._M_current)->loc).column = local_138.loc.column;
          *(undefined4 *)&((__position._M_current)->loc).field_0x14 = local_138.loc._20_4_;
          (__position._M_current)->type = local_138.type;
          ((__position._M_current)->loc).name = local_138.loc.name;
          *(long *)(this_00 + 0x10) = *(long *)(this_00 + 0x10) + 0x20;
        }
        local_160 = (TArraySizes *)0x0;
        acceptArraySpecifier(this,&local_160);
        if (local_160 != (TArraySizes *)0x0) {
          (((*ppTVar2)->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
           ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1].type)->arraySizes = local_160;
        }
        iVar6 = (*(local_138.type)->_vptr_TType[10])();
        acceptPostDecls(this,(TQualifier *)CONCAT44(extraout_var,iVar6));
        bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
        if (bVar4) {
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2e])(this->parseContext,&local_f8,"struct-member initializers ignored","typedef");
          local_140 = (TIntermTyped *)0x0;
          bVar4 = acceptAssignmentExpression(this,&local_140);
          if (!bVar4) {
            pHVar11 = this->parseContext;
            pp_Var12 = (pHVar11->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar9 = "initializer";
            goto LAB_003a75a2;
          }
        }
        bVar4 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
        if (bVar4) break;
        bVar5 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
        bVar4 = true;
        if (!bVar5) {
          pHVar11 = this->parseContext;
          pp_Var12 = (pHVar11->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
          pcVar9 = ",";
          goto LAB_003a75a2;
        }
      }
      bVar4 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
      if (!bVar4) {
        pHVar11 = this->parseContext;
        pp_Var12 = (pHVar11->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar9 = ";";
        goto LAB_003a75a2;
      }
LAB_003a74d6:
      bVar3 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
    } while (!bVar3);
  }
  return bVar3;
}

Assistant:

bool HlslGrammar::acceptStructDeclarationList(TTypeList*& typeList, TIntermNode*& nodeList,
                                              TVector<TFunctionDeclarator>& declarators)
{
    typeList = new TTypeList();
    HlslToken idToken;

    do {
        // success on seeing the RIGHT_BRACE coming up
        if (peekTokenClass(EHTokRightBrace))
            break;

        // struct_declaration

        // attributes
        TAttributes attributes;
        acceptAttributes(attributes);

        bool declarator_list = false;

        // fully_specified_type
        TType memberType;
        if (! acceptFullySpecifiedType(memberType, nodeList, attributes)) {
            expected("member type");
            return false;
        }
        
        // merge in the attributes
        parseContext.transferTypeAttributes(token.loc, attributes, memberType);

        // struct_declarator COMMA struct_declarator ...
        bool functionDefinitionAccepted = false;
        do {
            if (! acceptIdentifier(idToken)) {
                expected("member name");
                return false;
            }

            if (peekTokenClass(EHTokLeftParen)) {
                // function_parameters
                if (!declarator_list) {
                    declarators.resize(declarators.size() + 1);
                    // request a token stream for deferred processing
                    functionDefinitionAccepted = acceptMemberFunctionDefinition(nodeList, memberType, *idToken.string,
                                                                                declarators.back());
                    if (functionDefinitionAccepted)
                        break;
                }
                expected("member-function definition");
                return false;
            } else {
                // add it to the list of members
                TTypeLoc member = { new TType(EbtVoid), token.loc };
                member.type->shallowCopy(memberType);
                member.type->setFieldName(*idToken.string);
                typeList->push_back(member);

                // array_specifier
                TArraySizes* arraySizes = nullptr;
                acceptArraySpecifier(arraySizes);
                if (arraySizes)
                    typeList->back().type->transferArraySizes(arraySizes);

                acceptPostDecls(member.type->getQualifier());

                // EQUAL assignment_expression
                if (acceptTokenClass(EHTokAssign)) {
                    parseContext.warn(idToken.loc, "struct-member initializers ignored", "typedef", "");
                    TIntermTyped* expressionNode = nullptr;
                    if (! acceptAssignmentExpression(expressionNode)) {
                        expected("initializer");
                        return false;
                    }
                }
            }
            // success on seeing the SEMICOLON coming up
            if (peekTokenClass(EHTokSemicolon))
                break;

            // COMMA
            if (acceptTokenClass(EHTokComma))
                declarator_list = true;
            else {
                expected(",");
                return false;
            }

        } while (true);

        // SEMI_COLON
        if (! functionDefinitionAccepted && ! acceptTokenClass(EHTokSemicolon)) {
            expected(";");
            return false;
        }

    } while (true);

    return true;
}